

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O3

Boxed_Value __thiscall
chaiscript::eval::Noop_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::
eval_internal(Noop_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *this,
             Dispatch_State *param_1)

{
  uint *puVar1;
  Type_Conversions *pTVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  Boxed_Value BVar3;
  Boxed_Value BVar4;
  
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
  super_AST_Node._vptr_AST_Node = (_func_int **)param_1[3].m_stack_holder._M_data;
  pTVar2 = param_1[3].m_conversions.m_conversions._M_data;
  *(Type_Conversions **)
   &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>).
    super_AST_Node.identifier = pTVar2;
  if (pTVar2 != (Type_Conversions *)0x0) {
    in_RDX._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded != '\0') {
      puVar1 = &(pTVar2->m_mutex)._M_impl._M_rwlock.__data.__wrphase_futex;
      *puVar1 = *puVar1 + 1;
      BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
      BVar3.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)this;
      return (Boxed_Value)
             BVar3.m_data.
             super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
    }
    LOCK();
    puVar1 = &(pTVar2->m_mutex)._M_impl._M_rwlock.__data.__wrphase_futex;
    *puVar1 = *puVar1 + 1;
    UNLOCK();
  }
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = in_RDX._M_pi;
  BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar4.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &) const override {
        // It's a no-op, that evaluates to "void"
        return val;
      }